

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

ImGuiTableSortSpecs * ImGui::TableGetSortSpecs(void)

{
  ImGuiTable *table;
  ImGuiTableSortSpecs *pIVar1;
  
  table = GImGui->CurrentTable;
  if ((table->Flags & 8) == 0) {
    pIVar1 = (ImGuiTableSortSpecs *)0x0;
  }
  else {
    if (table->IsLayoutLocked == false) {
      TableUpdateLayout(table);
    }
    if (table->IsSortSpecsDirty == true) {
      TableSortSpecsBuild(table);
    }
    pIVar1 = &table->SortSpecs;
  }
  return pIVar1;
}

Assistant:

ImGuiTableSortSpecs* ImGui::TableGetSortSpecs()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL);

    if (!(table->Flags & ImGuiTableFlags_Sortable))
        return NULL;

    // Require layout (in case TableHeadersRow() hasn't been called) as it may alter IsSortSpecsDirty in some paths.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    if (table->IsSortSpecsDirty)
        TableSortSpecsBuild(table);

    return &table->SortSpecs;
}